

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttreader.cc
# Opt level: O0

int __thiscall libwebvtt::VttReader::Open(VttReader *this,char *filename)

{
  FILE *pFVar1;
  char *filename_local;
  VttReader *this_local;
  
  if ((filename == (char *)0x0) || (this->file_ != (FILE *)0x0)) {
    this_local._4_4_ = -1;
  }
  else {
    pFVar1 = fopen(filename,"rb");
    this->file_ = (FILE *)pFVar1;
    if (this->file_ == (FILE *)0x0) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int VttReader::Open(const char* filename) {
  if (filename == NULL || file_ != NULL)
    return -1;

  file_ = fopen(filename, "rb");
  if (file_ == NULL)
    return -1;

  return 0;  // success
}